

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner2::~Runner2(Runner2 *this)

{
  std::
  _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
  ::~_Rb_tree(&(this->m_testsAlreadyRun)._M_t);
  Ptr<Catch::IReporter>::~Ptr(&this->m_reporter);
  std::ofstream::~ofstream(&this->m_ofs);
  return;
}

Assistant:

Runner2( Config& configWrapper )
        :   m_configWrapper( configWrapper ),
            m_config( configWrapper.data() )
        {
            openStream();
            makeReporter();
        }